

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)200>(Result *__return_storage_ptr__,Model *pipeline)

{
  PipelineClassifier *pPVar1;
  Pipeline *pipelineParams;
  
  if (pipeline->_oneof_case_[0] == 200) {
    pPVar1 = (pipeline->Type_).pipelineclassifier_;
  }
  else {
    pPVar1 = Specification::PipelineClassifier::default_instance();
  }
  pipelineParams = pPVar1->pipeline_;
  if (pipelineParams == (Pipeline *)0x0) {
    pipelineParams = (Pipeline *)&Specification::_Pipeline_default_instance_;
  }
  validate(__return_storage_ptr__,pipeline,pipelineParams);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_pipelineClassifier>(const Specification::Model& pipeline) {
        const auto& pipelineParams = pipeline.pipelineclassifier().pipeline();
        // TODO -- validate classifier interface
        return validate(pipeline, pipelineParams);
    }